

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.c
# Opt level: O0

void runpushcstr(runcxdef *ctx,char *str,size_t len,int sav)

{
  uchar uVar1;
  int iVar2;
  uchar *puVar3;
  long in_RDX;
  uchar *in_RSI;
  runcxdef *in_RDI;
  runsdef *unaff_retaddr;
  runsdef *in_stack_00000008;
  runsdef val;
  size_t need;
  char *dst;
  char *p;
  runsdef local_48;
  long local_38;
  uchar *local_30;
  uchar *local_28;
  long local_18;
  uchar *local_10;
  runcxdef *local_8;
  
  local_38 = in_RDX;
  for (local_28 = in_RSI; local_28 < in_RSI + in_RDX; local_28 = local_28 + 1) {
    iVar2 = (int)(char)*local_28;
    if (((iVar2 - 9U < 2) || (iVar2 == 0xd)) || (iVar2 == 0x5c)) {
      local_38 = local_38 + 1;
    }
  }
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  if ((uint)((int)in_RDI->runcxhtop - (int)in_RDI->runcxhp) <= (int)local_38 + 2U) {
    runhcmp((runcxdef *)need,val.runsv.runsvnum._4_4_,val.runsv.runsvnum._0_4_,(runsdef *)val._0_8_,
            in_stack_00000008,unaff_retaddr);
  }
  oswp2(local_8->runcxhp,(int)local_38 + 2);
  local_28 = local_10;
  local_30 = local_8->runcxhp + 2;
  for (; local_28 < local_10 + local_18; local_28 = local_28 + 1) {
    uVar1 = *local_28;
    if (uVar1 == '\t') {
      puVar3 = local_30 + 1;
      *local_30 = '\\';
      local_30 = local_30 + 2;
      *puVar3 = '\t';
    }
    else if ((uVar1 == '\n') || (uVar1 == '\r')) {
      puVar3 = local_30 + 1;
      *local_30 = '\\';
      local_30 = local_30 + 2;
      *puVar3 = 'n';
    }
    else if (uVar1 == '\\') {
      *local_30 = '\\';
      local_30[1] = '\\';
      local_30 = local_30 + 2;
    }
    else {
      *local_30 = *local_28;
      local_30 = local_30 + 1;
    }
  }
  local_48.runsv = (anon_union_8_4_1dda36f5_for_runsv)local_8->runcxhp;
  local_48.runstyp = '\x03';
  local_8->runcxhp = local_8->runcxhp + local_38 + 2;
  runrepush(local_8,&local_48);
  return;
}

Assistant:

void runpushcstr(runcxdef *ctx, char *str, size_t len, int sav)
{
    char    *p;
    char    *dst;
    size_t   need;
    runsdef  val;
    
    /* determine how much space we'll need after converting escapes */
    for (p = str, need = len ; p < str + len ; ++p)
    {
        switch(*p)
        {
        case '\\':
        case '\n':
        case '\r':
        case '\t':
            /* these characters need to be escaped */
            ++need;
            break;

        default:
            break;
        }
    }

    /* reserve space */
    runhres(ctx, need + 2, sav);

    /* set up the length prefix */
    oswp2(ctx->runcxhp, need + 2);

    /* copy the string, expanding escapes */
    for (p = str, dst = (char *)ctx->runcxhp + 2 ; p < str + len ; ++p)
    {
        switch(*p)
        {
        case '\\':
            *dst++ = '\\';
            *dst++ = '\\';
            break;

        case '\n':
        case '\r':
            *dst++ = '\\';
            *dst++ = 'n';
            break;

        case '\t':
            *dst++ = '\\';
            *dst++ = '\t';
            break;

        default:
            *dst++ = *p;
            break;
        }
    }

    /* push the return value */
    val.runsv.runsvstr = ctx->runcxhp;
    val.runstyp = DAT_SSTRING;
    ctx->runcxhp += need + 2;
    runrepush(ctx, &val);
}